

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

JavascriptPromiseCapability *
Js::JavascriptPromiseCapability::New
          (Var promise,Var resolve,Var reject,ScriptContext *scriptContext)

{
  Recycler *pRVar1;
  JavascriptPromiseCapability *this;
  TrackAllocData local_50;
  ScriptContext *local_28;
  ScriptContext *scriptContext_local;
  Var reject_local;
  Var resolve_local;
  Var promise_local;
  
  local_28 = scriptContext;
  scriptContext_local = (ScriptContext *)reject;
  reject_local = resolve;
  resolve_local = promise;
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
             ,0x801);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  this = (JavascriptPromiseCapability *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  JavascriptPromiseCapability(this,resolve_local,reject_local,scriptContext_local);
  return this;
}

Assistant:

JavascriptPromiseCapability* JavascriptPromiseCapability::New(Var promise, Var resolve, Var reject, ScriptContext* scriptContext)
    {
        return RecyclerNew(scriptContext->GetRecycler(), JavascriptPromiseCapability, promise, resolve, reject);
    }